

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O2

void __thiscall wasm::Instrumenter::addGlobals(Instrumenter *this,size_t numFuncs)

{
  Module *pMVar1;
  pointer puVar2;
  Function *this_00;
  pointer pNVar3;
  Instrumenter *pIVar4;
  char *in_RCX;
  pointer puVar5;
  Name *name;
  pointer pNVar6;
  Name root;
  Name root_00;
  string_view sVar7;
  Name local_b0;
  _Alloc_hider local_a0;
  anon_class_8_1_8991fb9c addGlobal;
  string local_80;
  string_view local_60;
  IString local_50;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *local_40;
  Instrumenter *local_38;
  
  if (this->config->storageKind == InGlobals) {
    pMVar1 = this->wasm;
    Name::Name(&local_b0,"monotonic_counter");
    root.super_IString.str._M_str = in_RCX;
    root.super_IString.str._M_len = (size_t)local_b0.super_IString.str._M_str;
    sVar7 = (string_view)
            Names::getValidGlobalName
                      ((Names *)pMVar1,(Module *)local_b0.super_IString.str._M_len,root);
    (this->counterGlobal).super_IString.str = sVar7;
    local_40 = &this->functionGlobals;
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::reserve(local_40,numFuncs);
    puVar2 = (this->wasm->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_38 = this;
    for (puVar5 = (this->wasm->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pIVar4 = local_38, puVar5 != puVar2;
        puVar5 = puVar5 + 1) {
      this_00 = (puVar5->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(this_00->super_Importable).module + 8) == (char *)0x0) {
        pMVar1 = local_38->wasm;
        IString::toString_abi_cxx11_(&local_80,(IString *)this_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffffff60,&local_80,"_timestamp");
        IString::IString(&local_50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffffff60);
        root_00.super_IString.str._M_str = in_RCX;
        root_00.super_IString.str._M_len = (size_t)local_50.str._M_str;
        local_60 = (string_view)
                   Names::getValidGlobalName((Names *)pMVar1,(Module *)local_50.str._M_len,root_00);
        std::vector<wasm::Name,_std::allocator<wasm::Name>_>::emplace_back<wasm::Name>
                  (local_40,(Name *)&local_60);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
        std::__cxx11::string::~string((string *)&local_80);
      }
    }
    local_a0._M_p = (pointer)local_38;
    addGlobals::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)&stack0xffffffffffffff60,
               (Name)(local_38->counterGlobal).super_IString.str);
    pNVar3 = (pIVar4->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pNVar6 = (pIVar4->functionGlobals).
                  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start; pNVar6 != pNVar3; pNVar6 = pNVar6 + 1) {
      addGlobals::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&stack0xffffffffffffff60,
                 (Name)(pNVar6->super_IString).str);
    }
  }
  return;
}

Assistant:

void Instrumenter::addGlobals(size_t numFuncs) {
  if (config.storageKind != WasmSplitOptions::StorageKind::InGlobals) {
    // Don't need globals
    return;
  }
  // Create fresh global names (over-reserves, but that's ok)
  counterGlobal = Names::getValidGlobalName(*wasm, "monotonic_counter");
  functionGlobals.reserve(numFuncs);
  ModuleUtils::iterDefinedFunctions(*wasm, [&](Function* func) {
    functionGlobals.push_back(
      Names::getValidGlobalName(*wasm, func->name.toString() + "_timestamp"));
  });

  // Create and add new globals
  auto addGlobal = [&](Name name) {
    auto global = Builder::makeGlobal(
      name,
      Type::i32,
      Builder(*wasm).makeConst(Literal::makeZero(Type::i32)),
      Builder::Mutable);
    global->hasExplicitName = true;
    wasm->addGlobal(std::move(global));
  };
  addGlobal(counterGlobal);
  for (auto& name : functionGlobals) {
    addGlobal(name);
  }
}